

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool WindowedKeyTest<Blob<258>,Blob<128>>
               (hashfunc<Blob<128>_> hash,int windowbits,bool testCollision,bool testDistribution,
               bool drawDiagram)

{
  pfHash p_Var1;
  reference pvVar2;
  byte in_CL;
  byte in_DL;
  uint in_ESI;
  byte in_R8B;
  int i;
  Blob<258> key;
  int minbit;
  int j;
  int testcount;
  bool result;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  int keycount;
  int keybits;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *this;
  size_type in_stack_ffffffffffffff68;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffff70;
  int local_74;
  Blob<258> local_6d;
  uint local_4c;
  uint local_48;
  int local_44;
  byte local_3d;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_30;
  uint local_18;
  undefined4 local_14;
  byte local_f;
  byte local_e;
  byte local_d;
  uint local_c;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_14 = 0x108;
  local_18 = 1 << (in_ESI & 0x1f);
  this = &local_30;
  local_c = in_ESI;
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x15e08d);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_3d = 1;
  local_44 = 0x108;
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x108,
         (ulong)local_c,0x108,(ulong)local_18);
  for (local_48 = 0; (int)local_48 <= local_44; local_48 = local_48 + 1) {
    local_4c = local_48;
    Blob<258>::Blob(&local_6d);
    for (local_74 = 0; local_74 < (int)local_18; local_74 = local_74 + 1) {
      Blob<258>::Blob((Blob<258> *)&stack0xffffffffffffff6b,local_74);
      Blob<258>::operator=(&local_6d,(Blob<258> *)&stack0xffffffffffffff6b);
      lrot((void *)CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
           in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      p_Var1 = hashfunc::operator_cast_to_function_pointer(local_8);
      pvVar2 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[]
                         (&local_30,(long)local_74);
      (*p_Var1)(&local_6d,0x21,0,pvVar2);
    }
    printf("Window at %3d - ",(ulong)local_48);
    in_stack_ffffffffffffff57 =
         TestHashList<Blob<128>>
                   ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)key.bytes._5_8_,
                    (bool)key.bytes[4],(bool)key.bytes[3],(bool)key.bytes[2],(bool)key.bytes[1],
                    (bool)key.bytes[0]);
    local_3d = (local_3d & 1 & in_stack_ffffffffffffff57) != 0;
  }
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector(this);
  return (bool)(local_3d & 1);
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, const int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  const int keycount = 1 << windowbits;

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;

  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;

    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;

      lrot(&key,sizeof(keytype),minbit);

      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);

    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);

    //printf("\n");
  }

  return result;
}